

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::CreateTar
               (char *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format)

{
  pointer pcVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  string *remote;
  Compress c;
  pointer pbVar3;
  string path;
  string cwd;
  cmArchiveWrite a;
  ofstream fout;
  string local_398;
  undefined4 local_374;
  string local_370;
  string local_350;
  string local_330;
  undefined1 local_310 [24];
  bool local_2f8;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  string local_2b0 [128];
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  remote = &local_398;
  local_374 = (undefined4)CONCAT71(in_register_00000009,verbose);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&local_350,(SystemTools *)0x1,SUB41(compressType,0));
  std::ofstream::ofstream(local_230,outFileName,_S_out|_S_bin);
  if ((abStack_210[(long)*(_func_int **)(local_230._0_8_ + -0x18)] & 5) == 0) {
    c = CompressNone;
    if (compressType < TarCompressNone) {
      c = *(Compress *)(&DAT_00558f6c + (ulong)compressType * 4);
    }
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    if (format->_M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"paxr","");
    }
    else {
      pcVar1 = (format->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_398,pcVar1,pcVar1 + format->_M_string_length);
    }
    cmArchiveWrite::cmArchiveWrite((cmArchiveWrite *)local_310,(ostream *)local_230,c,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign(local_2b0);
    local_2f8 = SUB41(local_374,0);
    pbVar3 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar3 != (files->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        pcVar1 = (pbVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,pcVar1,pcVar1 + pbVar3->_M_string_length);
        bVar2 = cmsys::SystemTools::FileIsFullPath(local_398._M_dataplus._M_p);
        if (bVar2) {
          RelativePath_abi_cxx11_
                    (&local_330,(cmSystemTools *)local_350._M_dataplus._M_p,
                     local_398._M_dataplus._M_p,(char *)remote);
          std::__cxx11::string::operator=((string *)&local_398,(string *)&local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
        }
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,local_398._M_dataplus._M_p,
                   local_398._M_dataplus._M_p + local_398._M_string_length);
        remote = (string *)0x0;
        bVar2 = cmArchiveWrite::Add((cmArchiveWrite *)local_310,&local_370,0,(char *)0x0,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        pbVar3 = pbVar3 + 1;
      } while (bVar2 && pbVar3 != (files->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar2 = local_2c8 == 0;
    if (!bVar2) {
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_398,local_2d0._M_p,local_2d0._M_p + local_2c8);
      Error(local_398._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_310);
  }
  else {
    local_310._0_8_ = (ostream *)(local_310 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_310,"Cannot open output file \"","");
    std::__cxx11::string::append(local_310);
    std::__cxx11::string::append(local_310);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::_M_append(local_310,(ulong)local_398._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    Error((char *)local_310._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
    if ((ostream *)local_310._0_8_ != (ostream *)(local_310 + 0x10)) {
      operator_delete((void *)local_310._0_8_,(ulong)((long)(uint *)local_310._16_8_ + 1));
    }
    bVar2 = false;
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmSystemTools::CreateTar(const char* outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName, std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = "Cannot open output file \"";
    e += outFileName;
    e += "\": ";
    e += cmSystemTools::GetLastSystemError();
    cmSystemTools::Error(e.c_str());
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format);

  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  for (std::vector<std::string>::const_iterator i = files.begin();
       i != files.end(); ++i) {
    std::string path = *i;
    if (cmSystemTools::FileIsFullPath(path.c_str())) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd.c_str(), path.c_str());
    }
    if (!a.Add(path)) {
      break;
    }
  }
  if (!a) {
    cmSystemTools::Error(a.GetError().c_str());
    return false;
  }
  return true;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}